

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

prod_bitset * __thiscall
CppGenerator::computeDependentLoops
          (prod_bitset *__return_storage_ptr__,CppGenerator *this,size_t view_id,
          prod_bitset presentFunctions,var_bitset relationBag,dyn_bitset *contributingViews,
          var_bitset varOrderBitset,dyn_bitset *addedOutLoops,size_t thisLoopID)

{
  pointer *pppVar1;
  ulong *puVar2;
  ulong *puVar3;
  pointer pDVar4;
  pointer pdVar5;
  pointer puVar6;
  iterator __position;
  unsigned_long *puVar7;
  pointer pDVar8;
  iterator iVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  var_bitset varOrderBitset_00;
  var_bitset varOrderBitset_01;
  var_bitset relationBag_00;
  var_bitset relationBag_01;
  _WordT _Var13;
  bool bVar14;
  bool bVar15;
  size_t sVar16;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  vector<DependentLoop,_std::allocator<DependentLoop>_> *this_00;
  Function *pFVar17;
  View *pVVar18;
  long lVar19;
  size_type sVar20;
  size_t incID;
  ulong uVar21;
  ulong uVar22;
  unsigned_long *puVar23;
  prod_bitset *__dest;
  long lVar24;
  undefined8 *puVar25;
  undefined8 *puVar26;
  ulong uVar27;
  size_t v;
  ulong uVar28;
  pointer this_01;
  byte bVar29;
  dyn_bitset loopFactors;
  size_t nextLoopID;
  dyn_bitset nonAddedOutLoops;
  dyn_bitset nextLoops;
  dyn_bitset remainingLoops;
  dyn_bitset nextConsideredLoops;
  prod_bitset loopFunctionMask;
  _Base_bitset<24UL> in_stack_fffffffffffff908;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_5d8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_5b8;
  prod_bitset *local_598;
  _WordT local_590;
  _WordT local_588;
  ulong local_580;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_578;
  ulong local_558;
  ulong local_550;
  ulong local_548;
  _WordT local_540 [2];
  dyn_bitset local_530;
  dyn_bitset local_510;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_4f0;
  DependentLoop local_4d0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_398 [6];
  _WordT local_2d8;
  _WordT _Stack_2d0;
  _WordT local_2c8;
  _WordT _Stack_2c0;
  dyn_bitset local_2b0;
  dyn_bitset local_290;
  ulong local_270 [24];
  undefined8 local_1b0 [24];
  undefined8 local_f0 [24];
  
  local_588 = relationBag.super__Base_bitset<2UL>._M_w[1];
  local_590 = relationBag.super__Base_bitset<2UL>._M_w[0];
  bVar29 = 0;
  local_540[0] = local_590;
  local_540[1] = local_588;
  sVar16 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_5d8,sVar16 + 1,0,(allocator<unsigned_long> *)&local_4d0);
  sVar16 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  local_598 = __return_storage_ptr__;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_4f0,sVar16 + 1,0,(allocator<unsigned_long> *)&local_4d0);
  memset(local_270,0,0xc0);
  pDVar4 = (this->depListOfLoops).super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_558 = QueryCompiler::numberOfViews
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  b = &pDVar4[thisLoopID].loopFactors;
  if (local_558 != 0) {
    do {
      if (((b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[local_558 >> 6] >> (local_558 & 0x3f) & 1) != 0)
      goto LAB_00255fbe;
      local_558 = local_558 - 1;
    } while (local_558 != 0);
  }
  local_558 = 0;
LAB_00255fbe:
  pdVar5 = (this->outViewLoop).
           super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4d0,
             addedOutLoops);
  boost::operator&(&local_578,pdVar5 + view_id,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4d0);
  if (local_4d0.functionMask.
      super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d0.functionMask.
                    super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  this_00 = &this->depListOfLoops;
  uVar28 = 0;
  do {
    uVar21 = uVar28 >> 6;
    local_550 = 1L << ((byte)uVar28 & 0x3f);
    if ((presentFunctions.super__Base_bitset<24UL>._M_w[uVar21] >> (uVar28 & 0x3f) & 1) != 0) {
      pFVar17 = QueryCompiler::getFunction
                          ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,uVar28);
      local_580 = uVar21;
      local_548 = uVar28;
      if (local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start !=
          local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        memset(local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,0,
               (long)local_5d8.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_5d8.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start & 0xfffffffffffffff8);
      }
      uVar28 = 0;
      do {
        uVar21 = uVar28 >> 6;
        uVar27 = 1L << ((byte)uVar28 & 0x3f);
        if ((((pFVar17->_fVars).super__Base_bitset<2UL>._M_w[uVar21] >> (uVar28 & 0x3f) & 1) != 0)
           && ((varOrderBitset.super__Base_bitset<2UL>._M_w[uVar21] & uVar27) == 0)) {
          if ((local_540[uVar21] & uVar27) == 0) {
            for (uVar22 = 0;
                sVar16 = QueryCompiler::numberOfViews
                                   ((this->_qc).
                                    super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr), uVar22 < sVar16; uVar22 = uVar22 + 1) {
              bVar10 = (byte)uVar22;
              if ((((contributingViews->m_bits).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) &&
                 (pVVar18 = QueryCompiler::getView
                                      ((this->_qc).
                                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,uVar22),
                 ((pVVar18->_fVars).super__Base_bitset<2UL>._M_w[uVar21] & uVar27) != 0)) {
                uVar21 = (uVar22 >> 6) << 3;
                goto LAB_00256126;
              }
            }
          }
          else {
            sVar16 = QueryCompiler::numberOfViews
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            bVar10 = (byte)sVar16;
            uVar21 = sVar16 >> 3 & 0xfffffffffffffff8;
LAB_00256126:
            *(ulong *)(uVar21 + (long)local_5d8.m_bits.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start) =
                 *(ulong *)(uVar21 + (long)local_5d8.m_bits.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start) |
                 1L << (bVar10 & 0x3f);
          }
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != 100);
      boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4d0,
                       &local_5d8,&local_578);
      uVar28 = local_548;
      if ((long)local_4d0.functionMask.
                super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_4d0.functionMask.
                super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_00256238:
        if ((long)local_578.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_578.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_00256316:
          bVar15 = false;
        }
        else {
          uVar21 = (long)local_578.m_bits.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_578.m_bits.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          if (*local_578.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start == 0) {
            uVar27 = 1;
            do {
              uVar22 = uVar27;
              if (uVar21 + (uVar21 == 0) == uVar22) break;
              uVar27 = uVar22 + 1;
            } while (local_578.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar22] == 0);
            if (uVar21 <= uVar22) goto LAB_00256316;
          }
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                    (&local_5b8,
                     (this->outViewLoop).
                     super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + view_id);
          boost::operator&(local_398,&local_5d8,&local_5b8);
          if ((long)local_398[0].m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_398[0].m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start == 0) {
            bVar15 = false;
LAB_0025632c:
            if (local_398[0].m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_00256331;
          }
          else {
            uVar21 = (long)local_398[0].m_bits.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_398[0].m_bits.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
            bVar15 = true;
            if (*local_398[0].m_bits.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start == 0) {
              uVar27 = 1;
              do {
                uVar22 = uVar27;
                if (uVar21 + (uVar21 == 0) == uVar22) {
                  bVar15 = uVar22 < uVar21;
                  goto LAB_0025632c;
                }
                uVar27 = uVar22 + 1;
              } while (local_398[0].m_bits.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar22] == 0);
              bVar15 = uVar22 < uVar21;
            }
LAB_00256331:
            operator_delete(local_398[0].m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_5b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_5b8.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
LAB_00256350:
        if (local_4d0.functionMask.
            super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.functionMask.
                          super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar21 = local_580;
        if (!bVar15) {
          if ((long)local_5d8.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_5d8.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar19 = (long)local_5d8.m_bits.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_5d8.m_bits.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
            puVar6 = (addedOutLoops->m_bits).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar24 = 0;
            do {
              local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar24] =
                   local_5d8.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar24] | puVar6[lVar24];
              lVar24 = lVar24 + 1;
            } while (lVar19 + (ulong)(lVar19 == 0) != lVar24);
          }
          bVar15 = boost::operator==(&local_5d8,b);
          if (bVar15) {
            local_270[uVar21] = local_270[uVar21] | local_550;
          }
          else {
            boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &local_4d0,b,&local_5d8);
            bVar15 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                        *)&local_4d0,b);
            if (local_4d0.functionMask.
                super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_4d0.functionMask.
                              super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar15) {
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                        (local_398,b);
              boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &local_4d0,&local_5d8,local_398);
              if (local_398[0].m_bits.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_398[0].m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if ((long)local_4d0.functionMask.
                        super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_4d0.functionMask.
                        super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0) {
                uVar21 = (long)local_4d0.functionMask.
                               super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_4d0.functionMask.
                               super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3;
                if ((local_4d0.functionMask.
                     super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first == 0) {
                  uVar27 = 1;
                  do {
                    uVar22 = uVar27;
                    if (uVar21 + (uVar21 == 0) == uVar22) break;
                    uVar27 = uVar22 + 1;
                  } while (((local_4d0.functionMask.
                             super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->second).
                           super__Base_bitset<24UL>._M_w[uVar22 - 1] == 0);
                  if (uVar21 <= uVar22) goto LAB_002564c9;
                }
                sVar20 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                         find_next((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_4d0,local_558);
                if (sVar20 == 0xffffffffffffffff) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"We found a remaining Loop which is not higher ",
                             0x2e);
                  std::operator<<((ostream *)&std::cerr," than the highest considered loop?!\n");
                  goto LAB_00256e43;
                }
                local_4f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[sVar20 >> 6] =
                     local_4f0.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar20 >> 6] | 1L << ((byte)sVar20 & 0x3f);
              }
LAB_002564c9:
              if (local_4d0.functionMask.
                  super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0025620b;
            }
          }
        }
      }
      else {
        uVar21 = (long)local_4d0.functionMask.
                       super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_4d0.functionMask.
                       super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        if ((local_4d0.functionMask.
             super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first == 0) {
          uVar27 = 1;
          do {
            uVar22 = uVar27;
            if (uVar21 + (uVar21 == 0) == uVar22) break;
            uVar27 = uVar22 + 1;
          } while (((local_4d0.functionMask.
                     super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super__Base_bitset<24UL>.
                   _M_w[uVar22 - 1] == 0);
          bVar15 = true;
          if (uVar21 <= uVar22) goto LAB_00256238;
          goto LAB_00256350;
        }
LAB_0025620b:
        operator_delete(local_4d0.functionMask.
                        super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    uVar28 = uVar28 + 1;
  } while (uVar28 != 0x5dc);
  memcpy(&local_4d0,local_270,0xc0);
  lVar19 = 0;
  do {
    uVar11 = *(uint *)((long)local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w +
                      lVar19 * 8 + -0x74);
    _Var13 = local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w[lVar19 + -0xe];
    uVar12 = *(uint *)((long)local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w +
                      lVar19 * 8 + -0x6c);
    *(uint *)(local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w + lVar19 + -0xf) =
         (uint)local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w[lVar19 + -0xf] ^ 0xffffffff;
    *(uint *)((long)local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w + lVar19 * 8 + -0x74) =
         uVar11 ^ 0xffffffff;
    *(uint *)(local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w + lVar19 + -0xe) =
         (uint)_Var13 ^ 0xffffffff;
    *(uint *)((long)local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w + lVar19 * 8 + -0x6c) =
         uVar12 ^ 0xffffffff;
    lVar19 = lVar19 + 2;
  } while (lVar19 != 0x18);
  local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w[8] =
       local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w[8] & 0xfffffff;
  memcpy(local_398,&local_4d0,0xc0);
  lVar19 = 0;
  do {
    uVar28 = *(ulong *)((long)&local_398[0].m_bits.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish + lVar19 * 8);
    uVar21 = presentFunctions.super__Base_bitset<24UL>._M_w[lVar19 + 1];
    presentFunctions.super__Base_bitset<24UL>._M_w[lVar19] =
         presentFunctions.super__Base_bitset<24UL>._M_w[lVar19] &
         *(ulong *)((long)&local_398[0].m_bits.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar19 * 8);
    presentFunctions.super__Base_bitset<24UL>._M_w[lVar19 + 1] = uVar21 & uVar28;
    lVar19 = lVar19 + 2;
  } while (lVar19 != 0x18);
  this_01 = (this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)._M_impl.
            super__Vector_impl_data._M_start + thisLoopID;
  if (local_270[0] == 0) {
    uVar28 = 0xffffffffffffffff;
    do {
      if (uVar28 == 0x16) goto LAB_00256613;
      uVar21 = uVar28 + 1;
      lVar19 = uVar28 + 2;
      uVar28 = uVar21;
    } while (local_270[lVar19] == 0);
    if (uVar21 < 0x17) goto LAB_0025658a;
  }
  else {
LAB_0025658a:
    local_4d0.functionMask.
    super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)view_id;
    memcpy(&local_4d0.functionMask.
            super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish,local_270,0xc0);
    __position._M_current =
         *(pointer *)
          ((long)&(this_01->functionMask).
                  super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                  ._M_impl + 8);
    if (__position._M_current ==
        *(pointer *)
         ((long)&(this_01->functionMask).
                 super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                 ._M_impl + 0x10)) {
      std::
      vector<std::pair<unsigned_long,std::bitset<1500ul>>,std::allocator<std::pair<unsigned_long,std::bitset<1500ul>>>>
      ::_M_realloc_insert<std::pair<unsigned_long,std::bitset<1500ul>>>
                ((vector<std::pair<unsigned_long,std::bitset<1500ul>>,std::allocator<std::pair<unsigned_long,std::bitset<1500ul>>>>
                  *)this_01,__position,(pair<unsigned_long,_std::bitset<1500UL>_> *)&local_4d0);
    }
    else {
      memcpy(__position._M_current,&local_4d0,200);
      pppVar1 = (pointer *)
                ((long)&(this_01->functionMask).
                        super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                        ._M_impl + 8);
      *pppVar1 = *pppVar1 + 1;
    }
  }
LAB_00256613:
  for (uVar28 = 0;
      sVar16 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr), uVar28 < sVar16 + 1; uVar28 = uVar28 + 1) {
    uVar27 = 1L << ((byte)uVar28 & 0x3f);
    uVar21 = uVar28 >> 6;
    if ((local_4f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[uVar21] >> (uVar28 & 0x3f) & 1) != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_398[0].m_bits,&b->m_bits);
      local_398[0].m_num_bits = pDVar4[thisLoopID].loopFactors.m_num_bits;
      local_398[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar21] =
           local_398[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar21] | uVar27;
      if ((*(ulong *)(*(long *)&(this->outViewLoop).
                                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[view_id].m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl + uVar21 * 8) & uVar27) != 0) {
        std::operator<<((ostream *)&std::cerr,
                        "THERE IS A MISTAKE WITH NEXT CONSIDERED LOOPS IN DEP COMP\n");
LAB_00256e43:
        exit(1);
      }
      puVar23 = (this_01->next).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar7 = *(pointer *)
                ((long)&(this_01->next).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
                8);
      if (puVar23 == puVar7) {
LAB_0025671a:
        local_5b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(((long)(this->depListOfLoops).
                              super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->depListOfLoops).
                              super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97);
        sVar16 = QueryCompiler::numberOfViews
                           ((this->_qc).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        DependentLoop::DependentLoop(&local_4d0,sVar16);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&local_4d0.loopFactors.m_bits,&local_398[0].m_bits);
        local_4d0.loopFactors.m_num_bits = local_398[0].m_num_bits;
        local_4d0.loopVariable = uVar28;
        std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back(this_00,&local_4d0);
        pDVar8 = (this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar9._M_current =
             *(pointer *)
              ((long)&pDVar8[thisLoopID].next.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
        ;
        if (iVar9._M_current ==
            *(pointer *)
             ((long)&pDVar8[thisLoopID].next.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
             0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pDVar8[thisLoopID].next
                     ,iVar9,(unsigned_long *)&local_5b8);
        }
        else {
          *iVar9._M_current =
               (unsigned_long)
               local_5b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
          *(unsigned_long **)
           ((long)&pDVar8[thisLoopID].next.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
               iVar9._M_current + 1;
        }
        if (local_4d0.loopFactors.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.loopFactors.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_4d0.outView.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.outView.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_4d0.next.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.next.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_4d0.functionMask.
            super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.functionMask.
                          super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        bVar15 = false;
        do {
          while (bVar14 = boost::operator==(&(this_00->
                                             super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>
                                             )._M_impl.super__Vector_impl_data._M_start[*puVar23].
                                             loopFactors,local_398), !bVar14) {
            puVar23 = puVar23 + 1;
            if (puVar23 == puVar7) {
              if (!bVar15) goto LAB_0025671a;
              goto LAB_0025682f;
            }
          }
          local_5b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)*puVar23;
          puVar23 = puVar23 + 1;
          bVar15 = true;
        } while (puVar23 != puVar7);
      }
LAB_0025682f:
      memcpy(local_f0,&presentFunctions,0xc0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_510.m_bits,&contributingViews->m_bits);
      local_510.m_num_bits = contributingViews->m_num_bits;
      local_2c8 = varOrderBitset.super__Base_bitset<2UL>._M_w[0];
      _Stack_2c0 = varOrderBitset.super__Base_bitset<2UL>._M_w[1];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_290.m_bits,&addedOutLoops->m_bits);
      puVar6 = local_5b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_290.m_num_bits = addedOutLoops->m_num_bits;
      puVar25 = local_f0;
      puVar26 = (undefined8 *)&stack0xfffffffffffff908;
      for (lVar19 = 0x18; lVar19 != 0; lVar19 = lVar19 + -1) {
        *puVar26 = *puVar25;
        puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
        puVar26 = puVar26 + (ulong)bVar29 * -2 + 1;
      }
      relationBag_00.super__Base_bitset<2UL>._M_w[1] = local_588;
      relationBag_00.super__Base_bitset<2UL>._M_w[0] = local_590;
      varOrderBitset_00.super__Base_bitset<2UL>._M_w[1] = _Stack_2c0;
      varOrderBitset_00.super__Base_bitset<2UL>._M_w[0] = local_2c8;
      computeDependentLoops
                ((prod_bitset *)&local_4d0,this,view_id,(prod_bitset)in_stack_fffffffffffff908._M_w,
                 relationBag_00,&local_510,varOrderBitset_00,&local_290,(size_t)puVar6);
      if (local_290.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_290.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_510.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_510.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pDVar8 = (this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar19 = 0;
      do {
        uVar21 = local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w[lVar19 + -0xe];
        puVar3 = (ulong *)((long)pDVar8[thisLoopID].branchFunctions.super__Base_bitset<24UL>._M_w +
                          lVar19 * 8);
        uVar27 = puVar3[1];
        puVar2 = (ulong *)((long)pDVar8[thisLoopID].branchFunctions.super__Base_bitset<24UL>._M_w +
                          lVar19 * 8);
        *puVar2 = *puVar3 | local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w[lVar19 + -0xf];
        puVar2[1] = uVar27 | uVar21;
        lVar19 = lVar19 + 2;
      } while (lVar19 != 0x18);
      if (local_398[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_398[0].m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  bVar15 = boost::operator==((this->outViewLoop).
                             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + view_id,b);
  __dest = local_598;
  if (bVar15) {
    puVar3 = (ulong *)(*(long *)&(this_00->
                                 super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>).
                                 _M_impl.super__Vector_impl_data._M_start[thisLoopID].outView.m_bits
                                 .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      + (view_id >> 6) * 8);
    *puVar3 = *puVar3 | 1L << ((byte)view_id & 0x3f);
  }
  bVar15 = boost::operator==(b,addedOutLoops);
  if ((bVar15) &&
     ((long)local_578.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_578.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != 0)) {
    uVar28 = (long)local_578.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_578.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (*local_578.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start == 0) {
      uVar21 = 1;
      do {
        uVar27 = uVar21;
        if (uVar28 + (uVar28 == 0) == uVar27) break;
        uVar21 = uVar27 + 1;
      } while (local_578.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar27] == 0);
      if (uVar28 <= uVar27) goto LAB_00256dbd;
    }
    sVar20 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                       (&local_578,0);
    if (sVar20 != 0xffffffffffffffff) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_398[0].m_bits,&b->m_bits);
      uVar28 = 1L << ((byte)sVar20 & 0x3f);
      local_398[0].m_num_bits = pDVar4[thisLoopID].loopFactors.m_num_bits;
      local_398[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[sVar20 >> 6] =
           local_398[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar20 >> 6] | uVar28;
      puVar23 = (this_01->next).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar7 = *(pointer *)
                ((long)&(this_01->next).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
                8);
      if (puVar23 == puVar7) {
LAB_00256b35:
        local_5b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(((long)(this->depListOfLoops).
                              super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->depListOfLoops).
                              super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97);
        sVar16 = QueryCompiler::numberOfViews
                           ((this->_qc).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        DependentLoop::DependentLoop(&local_4d0,sVar16);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&local_4d0.loopFactors.m_bits,&local_398[0].m_bits);
        local_4d0.loopFactors.m_num_bits = local_398[0].m_num_bits;
        local_4d0.loopVariable = sVar20;
        std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back(this_00,&local_4d0);
        pDVar4 = (this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar9._M_current =
             *(pointer *)
              ((long)&pDVar4[thisLoopID].next.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
        ;
        if (iVar9._M_current ==
            *(pointer *)
             ((long)&pDVar4[thisLoopID].next.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
             0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pDVar4[thisLoopID].next
                     ,iVar9,(unsigned_long *)&local_5b8);
        }
        else {
          *iVar9._M_current =
               (unsigned_long)
               local_5b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
          *(unsigned_long **)
           ((long)&pDVar4[thisLoopID].next.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
               iVar9._M_current + 1;
        }
        if (local_4d0.loopFactors.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.loopFactors.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_4d0.outView.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.outView.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_4d0.next.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.next.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_4d0.functionMask.
            super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.functionMask.
                          super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        bVar15 = false;
        do {
          while (bVar14 = boost::operator==(&(this_00->
                                             super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>
                                             )._M_impl.super__Vector_impl_data._M_start[*puVar23].
                                             loopFactors,local_398), !bVar14) {
            puVar23 = puVar23 + 1;
            if (puVar23 == puVar7) {
              if (!bVar15) goto LAB_00256b35;
              goto LAB_00256c47;
            }
          }
          local_5b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)*puVar23;
          puVar23 = puVar23 + 1;
          bVar15 = true;
        } while (puVar23 != puVar7);
      }
LAB_00256c47:
      puVar3 = (addedOutLoops->m_bits).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + (sVar20 >> 6);
      *puVar3 = *puVar3 | uVar28;
      memcpy(local_1b0,&presentFunctions,0xc0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_530.m_bits,&contributingViews->m_bits);
      local_530.m_num_bits = contributingViews->m_num_bits;
      local_2d8 = varOrderBitset.super__Base_bitset<2UL>._M_w[0];
      _Stack_2d0 = varOrderBitset.super__Base_bitset<2UL>._M_w[1];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_2b0.m_bits,&addedOutLoops->m_bits);
      puVar6 = local_5b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_2b0.m_num_bits = addedOutLoops->m_num_bits;
      puVar25 = local_1b0;
      puVar26 = (undefined8 *)&stack0xfffffffffffff908;
      for (lVar19 = 0x18; lVar19 != 0; lVar19 = lVar19 + -1) {
        *puVar26 = *puVar25;
        puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
        puVar26 = puVar26 + (ulong)bVar29 * -2 + 1;
      }
      relationBag_01.super__Base_bitset<2UL>._M_w[1] = local_588;
      relationBag_01.super__Base_bitset<2UL>._M_w[0] = local_590;
      varOrderBitset_01.super__Base_bitset<2UL>._M_w[1] = _Stack_2d0;
      varOrderBitset_01.super__Base_bitset<2UL>._M_w[0] = local_2d8;
      computeDependentLoops
                ((prod_bitset *)&local_4d0,this,view_id,(prod_bitset)in_stack_fffffffffffff908._M_w,
                 relationBag_01,&local_530,varOrderBitset_01,&local_2b0,(size_t)puVar6);
      __dest = local_598;
      if (local_2b0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b0.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_530.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_530.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pDVar4 = (this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar19 = 0;
      do {
        uVar28 = local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w[lVar19 + -0xe];
        puVar3 = (ulong *)((long)pDVar4[thisLoopID].branchFunctions.super__Base_bitset<24UL>._M_w +
                          lVar19 * 8);
        uVar21 = puVar3[1];
        puVar2 = (ulong *)((long)pDVar4[thisLoopID].branchFunctions.super__Base_bitset<24UL>._M_w +
                          lVar19 * 8);
        *puVar2 = *puVar3 | local_4d0.branchFunctions.super__Base_bitset<24UL>._M_w[lVar19 + -0xf];
        puVar2[1] = uVar21 | uVar28;
        lVar19 = lVar19 + 2;
      } while (lVar19 != 0x18);
      if (local_398[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_398[0].m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
LAB_00256dbd:
  memcpy(__dest,&(this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>).
                 _M_impl.super__Vector_impl_data._M_start[thisLoopID].branchFunctions,0xc0);
  if (local_578.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_578.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f0.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5d8.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __dest;
}

Assistant:

prod_bitset CppGenerator::computeDependentLoops(
    size_t view_id, prod_bitset presentFunctions, var_bitset relationBag,
    dyn_bitset contributingViews, var_bitset varOrderBitset,
    dyn_bitset addedOutLoops, size_t thisLoopID)
{
    dyn_bitset loopFactors(_qc->numberOfViews()+1);
    dyn_bitset nextLoops(_qc->numberOfViews()+1);

    prod_bitset loopFunctionMask;

    const dyn_bitset& consideredLoops = depListOfLoops[thisLoopID].loopFactors;

    size_t highestPosition = 0;
    // need to continue with this the next loop
    for (size_t view=_qc->numberOfViews(); view > 0; view--)
    {
        if (consideredLoops[view])
        {
            highestPosition = view;
            break;
        }
    }

    
    dyn_bitset nonAddedOutLoops = outViewLoop[view_id] & ~addedOutLoops;

    // then find all loops required to compute these functions and create masks
    for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
    {
        if (presentFunctions[f])
        {
            const var_bitset& functionVars = _qc->getFunction(f)->_fVars;
            loopFactors.reset();
            
            for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
            {
                if (functionVars[v] && !varOrderBitset[v])
                {
                    if (relationBag[v])
                        loopFactors.set(_qc->numberOfViews());
                    else
                    {
                        for (size_t incID = 0; incID < _qc->numberOfViews(); ++incID)
                        {
                            if (contributingViews[incID])
                            {
                                View* incView = _qc->getView(incID);
                                const var_bitset& incViewBitset = incView->_fVars;
                                if (incViewBitset[v])
                                {
                                    loopFactors.set(incID);
                                    break;
                                }
                            }
                        }
                    }
                }
            }

            // TODO: TODO: Consider this again 
            if ((loopFactors & nonAddedOutLoops).any() ||
                (nonAddedOutLoops.any() && (loopFactors & ~outViewLoop[view_id]).any()))
                continue;
            
            loopFactors |= addedOutLoops;
            
            if (loopFactors == consideredLoops)
            {
                // Add this function to the mask for this loop
                loopFunctionMask.set(f);
            }
            else
            {
                if ((consideredLoops & loopFactors) == consideredLoops)
                {
                    dyn_bitset remainingLoops = loopFactors & ~consideredLoops;
                    if (remainingLoops.any())
                    {
                        size_t next = remainingLoops.find_next(highestPosition);
                        if (next != boost::dynamic_bitset<>::npos)
                            nextLoops.set(next);
                        else
                        {
                            ERROR("We found a remaining Loop which is not higher " <<
                                  " than the highest considered loop?!\n");
                            exit(1);
                        }
                    }
                }
            }
        }
    }
    
    presentFunctions &= ~loopFunctionMask;
    
    // Then use the registrar to split the functions to their loops
    DependentLoop& depLoop = depListOfLoops[thisLoopID];
    if (loopFunctionMask.any())
        depLoop.functionMask.push_back({view_id, loopFunctionMask});
    
    // Recurse to the next loops
    for (size_t viewID=0; viewID < _qc->numberOfViews() + 1; ++viewID)
    {
        if (nextLoops[viewID])
        {
            dyn_bitset nextConsideredLoops = consideredLoops;
            nextConsideredLoops.set(viewID);

            if (outViewLoop[view_id][viewID])
            {
                ERROR("THERE IS A MISTAKE WITH NEXT CONSIDERED LOOPS IN DEP COMP\n");
                exit(1);
            }

            // TODO: check the next loops for the given DependentLoop
            // if any of them use the same loop -- then reuse this one

            bool found = false;
            size_t nextLoopID;
            for (const size_t& potNextLoop : depLoop.next)
            {
                if (depListOfLoops[potNextLoop].loopFactors == nextConsideredLoops)
                {
                    found = true;
                    nextLoopID = potNextLoop;
                }
            }

            if (!found)
            {
                nextLoopID = depListOfLoops.size();

                // otherwise add a new loop to the list with the correct loops and
                // loopVariable and then add this new loop to next of this loop
                DependentLoop newDepLoop(_qc->numberOfViews());
                newDepLoop.loopFactors = nextConsideredLoops;
                newDepLoop.loopVariable = viewID;

                // std::cout << "#########" << newDepLoop.loopFactors << std::endl;
                
                depListOfLoops.push_back(newDepLoop);

                // std::cout << depLoop.next.size() << std::endl;
                depListOfLoops[thisLoopID].next.push_back(nextLoopID);
            }

            prod_bitset branch =
                computeDependentLoops(view_id,presentFunctions,relationBag,
                                      contributingViews, varOrderBitset,
                                      addedOutLoops,nextLoopID);

            depListOfLoops[thisLoopID].branchFunctions |= branch;
        }
    }

    if (outViewLoop[view_id] == consideredLoops)
        depListOfLoops[thisLoopID].outView.set(view_id);

    if (consideredLoops == addedOutLoops && nonAddedOutLoops.any())
    {
        size_t nextOutLoop = nonAddedOutLoops.find_first();
        if (nextOutLoop != boost::dynamic_bitset<>::npos)
        {
            dyn_bitset nextConsideredLoops = consideredLoops;
            nextConsideredLoops.set(nextOutLoop);

            bool found = false;
            size_t nextLoopID;
            for (const size_t& potNextLoop : depLoop.next)
            {
                if (depListOfLoops[potNextLoop].loopFactors == nextConsideredLoops)
                {
                    found = true;
                    nextLoopID = potNextLoop;
                }
            }

            if (!found)
            {
                nextLoopID = depListOfLoops.size();

                // otherwise add a new loop to the list with the correct loops and
                // loopVariable and then add this new loop to next of this loop
                DependentLoop newDepLoop(_qc->numberOfViews());
                newDepLoop.loopFactors = nextConsideredLoops;
                newDepLoop.loopVariable = nextOutLoop;
                
                
                depListOfLoops.push_back(newDepLoop);

                depListOfLoops[thisLoopID].next.push_back(nextLoopID);
            }

            addedOutLoops.set(nextOutLoop);

            prod_bitset branch =                
                computeDependentLoops(view_id,presentFunctions,relationBag,
                                      contributingViews,varOrderBitset,
                                      addedOutLoops,nextLoopID);

            depListOfLoops[thisLoopID].branchFunctions |= branch;
        }
    }
    
    return depListOfLoops[thisLoopID].branchFunctions;
}